

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O3

int __thiscall Fl_Input::kf_lines_down(Fl_Input *this,int repeat_num)

{
  bool bVar1;
  int iVar2;
  int i;
  uint uVar3;
  
  i = (this->super_Fl_Input_).position_;
  iVar2 = Fl_Input_::line_end(&this->super_Fl_Input_,i);
  if (iVar2 < (this->super_Fl_Input_).size_) {
    if (repeat_num != 0) {
      do {
        i = Fl_Input_::line_end(&this->super_Fl_Input_,i);
        if ((this->super_Fl_Input_).size_ <= i) break;
        i = i + 1;
        repeat_num = repeat_num + -1;
      } while (repeat_num != 0);
    }
    Fl_Input_::up_down_position(&this->super_Fl_Input_,i,Fl::e_state & 0x10000);
    uVar3 = 1;
  }
  else {
    bVar1 = Fl::option(OPTION_ARROW_FOCUS);
    uVar3 = (uint)!bVar1;
  }
  return uVar3;
}

Assistant:

int Fl_Input::kf_lines_down(int repeat_num) {
  int i = position();
  if (line_end(i) >= size()) {
    //UNNEEDED if (input_type()==FL_MULTILINE_INPUT && !Fl::option(Fl::OPTION_ARROW_FOCUS)) return 1;
    return NORMAL_INPUT_MOVE;
  }
  while (repeat_num--) {  
    i = line_end(i);
    if (i >= size()) break;
    i++;
  }
  shift_up_down_position(i);
  return 1;
}